

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_dict(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing dict : 10 of 13 functions ...\n");
  }
  iVar1 = test_xmlDictCleanup();
  iVar2 = test_xmlDictCreate();
  iVar3 = test_xmlDictCreateSub();
  iVar4 = test_xmlDictExists();
  iVar5 = test_xmlDictGetUsage();
  iVar6 = test_xmlDictLookup();
  iVar7 = test_xmlDictOwns();
  iVar8 = test_xmlDictQLookup();
  iVar9 = test_xmlDictReference();
  iVar10 = test_xmlDictSetLimit();
  iVar11 = test_xmlDictSize();
  iVar12 = test_xmlInitializeDict();
  uVar13 = iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 
                                                  + iVar1;
  if (uVar13 != 0) {
    printf("Module dict: %d errors\n",(ulong)uVar13);
  }
  return uVar13;
}

Assistant:

static int
test_dict(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing dict : 10 of 13 functions ...\n");
    test_ret += test_xmlDictCleanup();
    test_ret += test_xmlDictCreate();
    test_ret += test_xmlDictCreateSub();
    test_ret += test_xmlDictExists();
    test_ret += test_xmlDictGetUsage();
    test_ret += test_xmlDictLookup();
    test_ret += test_xmlDictOwns();
    test_ret += test_xmlDictQLookup();
    test_ret += test_xmlDictReference();
    test_ret += test_xmlDictSetLimit();
    test_ret += test_xmlDictSize();
    test_ret += test_xmlInitializeDict();

    if (test_ret != 0)
	printf("Module dict: %d errors\n", test_ret);
    return(test_ret);
}